

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockingPriorityQueue.hpp
# Opt level: O2

ActionMessage * __thiscall
gmlc::containers::BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>
::pop(ActionMessage *__return_storage_ptr__,
     BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable> *this)

{
  bool bVar1;
  _Elt_pointer act;
  pointer pAVar2;
  bool bVar3;
  unique_lock<std::mutex> pullLock;
  optional<helics::ActionMessage> val;
  unique_lock<std::mutex> local_1c0;
  _Optional_payload_base<helics::ActionMessage> local_1b0;
  _Optional_payload_base<helics::ActionMessage> local_f0;
  
  helics::ActionMessage::ActionMessage(__return_storage_ptr__);
  try_pop((optional<helics::ActionMessage> *)&local_1b0,this);
  bVar3 = false;
  do {
    if (local_1b0._M_engaged != false) {
      helics::ActionMessage::operator=(__return_storage_ptr__,(ActionMessage *)&local_1b0);
      std::_Optional_payload_base<helics::ActionMessage>::_M_reset(&local_1b0);
      return __return_storage_ptr__;
    }
    std::unique_lock<std::mutex>::unique_lock(&local_1c0,(mutex_type *)&this->m_pullLock);
    act = (this->priorityQueue).c.
          super__Deque_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>._M_impl.
          super__Deque_impl_data._M_start._M_cur;
    if ((this->priorityQueue).c.
        super__Deque_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur == act) {
      pAVar2 = (this->pullElements).
               super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if ((this->pullElements).
          super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>._M_impl.
          super__Vector_impl_data._M_start != pAVar2) {
LAB_0027d786:
        helics::ActionMessage::operator=(__return_storage_ptr__,pAVar2 + -1);
        std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::pop_back
                  ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)
                   &this->pullElements);
        goto LAB_0027d79e;
      }
      std::condition_variable::wait((unique_lock *)&this->condition);
      act = (this->priorityQueue).c.
            super__Deque_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>._M_impl
            .super__Deque_impl_data._M_start._M_cur;
      if ((this->priorityQueue).c.
          super__Deque_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>._M_impl.
          super__Deque_impl_data._M_finish._M_cur != act) goto LAB_0027d768;
      pAVar2 = (this->pullElements).
               super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if ((this->pullElements).
          super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>._M_impl.
          super__Vector_impl_data._M_start != pAVar2) goto LAB_0027d786;
      std::unique_lock<std::mutex>::unlock(&local_1c0);
      try_pop((optional<helics::ActionMessage> *)&local_f0,this);
      std::_Optional_payload_base<helics::ActionMessage>::_M_move_assign(&local_1b0,&local_f0);
      std::_Optional_payload_base<helics::ActionMessage>::_M_reset(&local_f0);
      bVar1 = true;
    }
    else {
LAB_0027d768:
      helics::ActionMessage::operator=(__return_storage_ptr__,act);
      CLI::std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::pop_front
                (&(this->priorityQueue).c);
LAB_0027d79e:
      bVar3 = true;
      bVar1 = false;
    }
    std::unique_lock<std::mutex>::~unique_lock(&local_1c0);
    if (!bVar1) {
      std::_Optional_payload_base<helics::ActionMessage>::_M_reset(&local_1b0);
      if (!bVar3) {
        helics::ActionMessage::~ActionMessage(__return_storage_ptr__);
      }
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

T pop()
        {
            T actval;
            auto val = try_pop();
            while (!val) {
                std::unique_lock<MUTEX> pullLock(
                    m_pullLock);  // get the lock then wait
                if (!priorityQueue.empty()) {
                    actval = std::move(priorityQueue.front());
                    priorityQueue.pop();
                    return actval;
                }
                if (!pullElements.empty())  // make sure we are actually empty;
                {
                    actval = std::move(pullElements.back());
                    pullElements.pop_back();
                    return actval;
                }
                condition.wait(pullLock);  // now wait
                if (!priorityQueue.empty()) {
                    actval = std::move(priorityQueue.front());
                    priorityQueue.pop();
                    return actval;
                }
                if (!pullElements.empty())  // check for spurious wake-ups
                {
                    actval = std::move(pullElements.back());
                    pullElements.pop_back();
                    return actval;
                }
                pullLock.unlock();
                val = try_pop();
            }
            // move the value out of the optional
            actval = std::move(*val);
            return actval;
        }